

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonblocking_notifier.hpp
# Opt level: O1

void __thiscall tf::NonblockingNotifierV2::_notify<false>(NonblockingNotifierV2 *this)

{
  pointer pWVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  __int_type_conflict1 _Var6;
  bool bVar7;
  
  _Var6 = (this->_state).super___atomic_base<unsigned_long>._M_i;
  do {
    uVar2 = (uint)(_Var6 >> 0xe) & 0x3fff;
    uVar5 = _Var6 >> 0x1c & 0x3fff;
    if (uVar2 == uVar5 && (_Var6 & 0x3fff) == 0x3fff) {
      return;
    }
    uVar4 = (uint)uVar5;
    if (uVar4 < uVar2) {
      uVar5 = _Var6 + 0x10000000;
    }
    else {
      uVar5 = _Var6 & 0x3ffffffc000 |
              *(ulong *)((long)&(((this->_waiters).
                                  super__Vector_base<tf::NonblockingNotifierV2::Waiter,_std::allocator<tf::NonblockingNotifierV2::Waiter>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->next).
                                super___atomic_base<unsigned_long>._M_i +
                        (ulong)(uint)((int)(_Var6 & 0x3fff) << 7));
    }
    LOCK();
    uVar3 = (this->_state).super___atomic_base<unsigned_long>._M_i;
    bVar7 = _Var6 == uVar3;
    if (bVar7) {
      (this->_state).super___atomic_base<unsigned_long>._M_i = uVar5;
      uVar3 = _Var6;
    }
    UNLOCK();
    if ((bVar7 && uVar2 <= uVar4) && ((uVar3 & 0x3fff) != 0x3fff)) {
      pWVar1 = (this->_waiters).
               super__Vector_base<tf::NonblockingNotifierV2::Waiter,_std::allocator<tf::NonblockingNotifierV2::Waiter>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar5 = (ulong)(uint)((int)(uVar3 & 0x3fff) << 7);
      *(undefined8 *)((long)&(pWVar1->next).super___atomic_base<unsigned_long>._M_i + uVar5) =
           0x3fff;
      _unpark(this,(Waiter *)((long)&(pWVar1->next).super___atomic_base<unsigned_long>._M_i + uVar5)
             );
    }
    _Var6 = uVar3;
  } while (!bVar7);
  return;
}

Assistant:

void _notify() {
    std::atomic_thread_fence(std::memory_order_seq_cst);
    uint64_t state = _state.load(std::memory_order_acquire);
    for (;;) {
      //_check_state(state);
      const uint64_t waiters = (state & kWaiterMask) >> kWaiterShift;
      const uint64_t signals = (state & kSignalMask) >> kSignalShift;
      // Easy case: no waiters.
      if ((state & kStackMask) == kStackMask && waiters == signals) return;
      uint64_t newstate;
      if (notifyAll) {
        // Empty wait stack and set signal to number of pre-wait threads.
        newstate = (state & kWaiterMask) | (waiters << kSignalShift) | kStackMask;
      } else if (signals < waiters) {
        // There is a thread in pre-wait state, unblock it.
        newstate = state + kSignalInc;
      } else {
        // Pop a waiter from list and unpark it.
        Waiter* w = &_waiters[state & kStackMask];
        uint64_t next = w->next.load(std::memory_order_relaxed);
        newstate = (state & (kWaiterMask | kSignalMask)) | next;
      }
      //_check_state(newstate);
      if (_state.compare_exchange_weak(state, newstate, std::memory_order_acq_rel)) {
        if (!notifyAll && (signals < waiters)) return;  // unblocked pre-wait thread
        if ((state & kStackMask) == kStackMask) return;
        Waiter* w = &_waiters[state & kStackMask];
        if (!notifyAll) w->next.store(kStackMask, std::memory_order_relaxed);
        _unpark(w);
        return;
      }
    }
  }